

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O2

IterateResult __thiscall VertexAttrib64Bit::GetVertexAttribTest::iterate(GetVertexAttribTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  GLint i;
  GLuint index;
  bool result;
  
  iVar1 = (*((this->super_Base).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  memcpy(&(this->super_Base).gl,(void *)CONCAT44(extraout_var,iVar1),0x1a28);
  result = true;
  Base::RequireExtension(&this->super_Base,"GL_ARB_vertex_attrib_64bit");
  initTest(this);
  for (index = 1; (int)index < this->m_max_vertex_attribs; index = index + 1) {
    checkVertexAttribLd<1u>(this,index,&result);
    checkVertexAttribLd<2u>(this,index,&result);
    checkVertexAttribLd<3u>(this,index,&result);
    checkVertexAttribLd<4u>(this,index,&result);
    checkVertexAttribLdv<1u>(this,index,&result);
    checkVertexAttribLdv<2u>(this,index,&result);
    checkVertexAttribLdv<3u>(this,index,&result);
    checkVertexAttribLdv<4u>(this,index,&result);
    checkVertexAttribLPointer(this,index,&result);
  }
  Base::IterateStop(&this->super_Base,result);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GetVertexAttribTest::iterate()
{
	IterateStart();

	bool result = true;

	RequireExtension("GL_ARB_vertex_attrib_64bit");

	initTest();

	for (GLint i = 1; i < m_max_vertex_attribs; ++i)
	{
		checkVertexAttribLd<1>(i, result);
		checkVertexAttribLd<2>(i, result);
		checkVertexAttribLd<3>(i, result);
		checkVertexAttribLd<4>(i, result);
		checkVertexAttribLdv<1>(i, result);
		checkVertexAttribLdv<2>(i, result);
		checkVertexAttribLdv<3>(i, result);
		checkVertexAttribLdv<4>(i, result);
		checkVertexAttribLPointer(i, result);
	}

	/* Done */
	return IterateStop(result);
}